

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall
mkvparser::VideoTrack::VideoTrack
          (VideoTrack *this,Segment *pSegment,longlong element_start,longlong element_size)

{
  undefined8 *in_RDI;
  longlong unaff_retaddr;
  
  Track::Track((Track *)element_start,(Segment *)element_size,unaff_retaddr,(longlong)in_RDI);
  *in_RDI = &PTR__VideoTrack_01fca778;
  in_RDI[0x1e] = 0;
  in_RDI[0x20] = 0;
  in_RDI[0x21] = 0;
  return;
}

Assistant:

VideoTrack::VideoTrack(Segment* pSegment, long long element_start,
                       long long element_size)
    : Track(pSegment, element_start, element_size),
      m_colour_space(NULL),
      m_colour(NULL),
      m_projection(NULL) {}